

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O0

int check_zero(test_state *state)

{
  int iVar1;
  long in_RDI;
  int status;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((*(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) & 8) == 0) {
    memset(*(void **)(in_RDI + 0x10),0,*(size_t *)(in_RDI + 0x30));
  }
  else {
    memset(*(void **)(in_RDI + 0x10),0x55,*(size_t *)(in_RDI + 0x30));
  }
  printf("Checking zero blocks ... ");
  iVar1 = check_block_sizes((test_state *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  if (iVar1 == 0) {
    printf("%s\n","\x1b[0;32mPASS\x1b[0m");
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int check_zero(struct test_state *state)
{
    int status;

    if (state->strm->flags & AEC_DATA_PREPROCESS)
        memset(state->ubuf, 0x55, state->buf_len);
    else
        memset(state->ubuf, 0, state->buf_len);

    printf("Checking zero blocks ... ");
    status = check_block_sizes(state, 0, state->id_len + 1);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}